

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O2

ssize_t __thiscall bitio::bitio_stream::write(bitio_stream *this,int __fd,void *__buf,size_t __n)

{
  uint64_t uVar1;
  byte bVar2;
  ulong in_RAX;
  ulong extraout_RAX;
  uchar uVar3;
  undefined4 in_register_00000034;
  void *pvVar4;
  
  for (pvVar4 = (void *)0x0; __buf != pvVar4; pvVar4 = (void *)((long)pvVar4 + 1)) {
    bVar2 = (*(ulong *)(ui64_single_bit_masks + (0x3f - ((ulong)pvVar4 & 0xff)) * 8) &
            CONCAT44(in_register_00000034,__fd) << (-(char)__buf & 0x3fU)) != 0 |
            this->bit_buffer * '\x02';
    in_RAX = (ulong)bVar2;
    this->bit_buffer = bVar2;
    uVar3 = this->bit_count + '\x01';
    this->bit_count = uVar3;
    if (uVar3 == '\b') {
      uVar1 = this->byte_index;
      this->byte_index = uVar1 + 1;
      this->byte_buffer[uVar1] = bVar2;
      in_RAX = this->byte_index;
      if (in_RAX == this->buffer_size) {
        wflush(this);
        this->byte_index = 0;
        in_RAX = extraout_RAX;
      }
      this->bit_buffer = '\0';
      this->bit_count = '\0';
    }
  }
  return in_RAX;
}

Assistant:

void bitio_stream::write(uint64_t obj, uint64_t n) {
    uint64_t i = 0;
    obj <<= 0x40 - n;

    unsigned char mask_index = 0;
    while (i++ < n) {
        bit_buffer <<= 1;
        bit_buffer += (obj & ui64_single_bit_masks[0x3f - mask_index++]) != 0;;
        bit_count++;
        if (bit_count == 8) {
            byte_buffer[byte_index++] = bit_buffer;
            if (byte_index == buffer_size) {
                wflush();
                byte_index = 0;
            }
            bit_buffer = 0;
            bit_count = 0;
        }

    }
}